

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::declareArray
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,TSymbol **symbol)

{
  pointer *pppTVar1;
  TSymbolTable *pTVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined4 extraout_var;
  TSymbol *pTVar6;
  undefined4 extraout_var_00;
  TPoolAllocator *this_01;
  TVariable *this_02;
  undefined4 extraout_var_01;
  pointer pcVar7;
  char *pcVar8;
  _func_int **pp_Var9;
  bool currentScope;
  bool local_31;
  TType *this_00;
  
  local_31 = SUB81((ulong)in_RAX >> 0x38,0);
  if (*symbol == (TSymbol *)0x0) {
    pTVar6 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                                &local_31,(int *)0x0);
    *symbol = pTVar6;
    if (((pTVar6 != (TSymbol *)0x0) &&
        (iVar4 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,0,3,"gl_"), iVar4 == 0)) &&
       (pTVar2 = (this->super_TParseContextBase).symbolTable,
       3 < (int)((ulong)((long)(pTVar2->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar2->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
LAB_004b5a62:
      *symbol = (TSymbol *)0x0;
      return;
    }
    if ((*symbol == (TSymbol *)0x0) || (local_31 == false)) {
      this_01 = GetThreadPoolAllocator();
      this_02 = (TVariable *)TPoolAllocator::allocate(this_01,0xf8);
      TVariable::TVariable(this_02,identifier,identifier,type,false);
      *symbol = (TSymbol *)this_02;
      TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_02);
      pTVar2 = (this->super_TParseContextBase).symbolTable;
      if ((int)((ulong)((long)(pTVar2->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar2->table).
                             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                  (this,*symbol);
      }
      pTVar2 = (this->super_TParseContextBase).symbolTable;
      if ((int)((ulong)((long)(pTVar2->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar2->table).
                             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) < 4) {
        return;
      }
      bVar3 = isIoResizeArray(this,type);
      if (!bVar3) {
        iVar4 = (*(*symbol)->_vptr_TSymbol[0xd])();
        fixIoArraySize(this,loc,(TType *)CONCAT44(extraout_var_01,iVar4));
        return;
      }
      __position._M_current =
           (this->ioArraySymbolResizeList).
           super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
           super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->ioArraySymbolResizeList).
          super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
          super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>::
        _M_realloc_insert<glslang::TSymbol*const&>
                  ((vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>> *)
                   &this->ioArraySymbolResizeList,__position,symbol);
      }
      else {
        *__position._M_current = *symbol;
        pppTVar1 = &(this->ioArraySymbolResizeList).
                    super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                    super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      bVar3 = true;
      goto LAB_004b5ba6;
    }
    iVar4 = (*(*symbol)->_vptr_TSymbol[0xb])();
    if (CONCAT44(extraout_var_00,iVar4) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot redeclare a user-block member array",
                 (identifier->_M_dataplus)._M_p,"");
      goto LAB_004b5a62;
    }
  }
  if (*symbol == (TSymbol *)0x0) {
    pcVar7 = (identifier->_M_dataplus)._M_p;
    pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar8 = "array variable name expected";
  }
  else {
    iVar4 = (*(*symbol)->_vptr_TSymbol[0xd])();
    this_00 = (TType *)CONCAT44(extraout_var,iVar4);
    iVar4 = (*this_00->_vptr_TType[0x1d])(this_00);
    if ((char)iVar4 == '\0') {
      pcVar7 = (identifier->_M_dataplus)._M_p;
      pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "redeclaring non-array as array";
    }
    else if ((type->field_0x8 == this_00->field_0x8) &&
            (bVar3 = TType::sameElementShape(this_00,type,(int *)0x0,(int *)0x0), bVar3)) {
      bVar3 = TType::sameInnerArrayness(this_00,type);
      if (bVar3) {
        iVar4 = (*this_00->_vptr_TType[0x1e])(this_00);
        if ((char)iVar4 == '\0') {
          iVar4 = (*type->_vptr_TType[0xf])(type);
          arrayLimitCheck(this,loc,identifier,iVar4);
          TType::updateArraySizes(this_00,type);
          bVar3 = isIoResizeArray(this,type);
          if (!bVar3) {
            return;
          }
          bVar3 = false;
LAB_004b5ba6:
          checkIoArraysConsistency(this,loc,bVar3);
          return;
        }
        bVar3 = isIoResizeArray(this,type);
        if (bVar3) {
          iVar4 = (*this_00->_vptr_TType[0xf])(this_00);
          iVar5 = (*type->_vptr_TType[0xf])(type);
          if (iVar4 == iVar5) {
            return;
          }
        }
        pcVar7 = (identifier->_M_dataplus)._M_p;
        pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar8 = "redeclaration of array with size";
      }
      else {
        pcVar7 = (identifier->_M_dataplus)._M_p;
        pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar8 = "redeclaration of array with a different array dimensions or sizes";
      }
    }
    else {
      pcVar7 = (identifier->_M_dataplus)._M_p;
      pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "redeclaration of array with a different element type";
    }
  }
  (*pp_Var9[0x2d])(this,loc,pcVar8,pcVar7,"");
  return;
}

Assistant:

void TParseContext::declareArray(const TSourceLoc& loc, const TString& identifier, const TType& type, TSymbol*& symbol)
{
    if (symbol == nullptr) {
        bool currentScope;
        symbol = symbolTable.find(identifier, nullptr, &currentScope);

        if (symbol && builtInName(identifier) && ! symbolTable.atBuiltInLevel()) {
            // bad shader (errors already reported) trying to redeclare a built-in name as an array
            symbol = nullptr;
            return;
        }
        if (symbol == nullptr || ! currentScope) {
            //
            // Successfully process a new definition.
            // (Redeclarations have to take place at the same scope; otherwise they are hiding declarations)
            //
            symbol = new TVariable(&identifier, type);
            symbolTable.insert(*symbol);
            if (symbolTable.atGlobalLevel())
                trackLinkage(*symbol);

            if (! symbolTable.atBuiltInLevel()) {
                if (isIoResizeArray(type)) {
                    ioArraySymbolResizeList.push_back(symbol);
                    checkIoArraysConsistency(loc, true);
                } else
                    fixIoArraySize(loc, symbol->getWritableType());
            }

            return;
        }
        if (symbol->getAsAnonMember()) {
            error(loc, "cannot redeclare a user-block member array", identifier.c_str(), "");
            symbol = nullptr;
            return;
        }
    }

    //
    // Process a redeclaration.
    //

    if (symbol == nullptr) {
        error(loc, "array variable name expected", identifier.c_str(), "");
        return;
    }

    // redeclareBuiltinVariable() should have already done the copyUp()
    TType& existingType = symbol->getWritableType();

    if (! existingType.isArray()) {
        error(loc, "redeclaring non-array as array", identifier.c_str(), "");
        return;
    }

    if (! existingType.sameElementType(type)) {
        error(loc, "redeclaration of array with a different element type", identifier.c_str(), "");
        return;
    }

    if (! existingType.sameInnerArrayness(type)) {
        error(loc, "redeclaration of array with a different array dimensions or sizes", identifier.c_str(), "");
        return;
    }

    if (existingType.isSizedArray()) {
        // be more leniant for input arrays to geometry shaders and tessellation control outputs, where the redeclaration is the same size
        if (! (isIoResizeArray(type) && existingType.getOuterArraySize() == type.getOuterArraySize()))
            error(loc, "redeclaration of array with size", identifier.c_str(), "");
        return;
    }

    arrayLimitCheck(loc, identifier, type.getOuterArraySize());

    existingType.updateArraySizes(type);

    if (isIoResizeArray(type))
        checkIoArraysConsistency(loc);
}